

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall libserver::server::_handle_login_req(server *this)

{
  ostream *poVar1;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->client_name);
  poVar1 = std::operator<<(poVar1," logged in");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"ok",&local_51);
  std::operator+(&local_50,&local_30,"\n");
  _write_to_socket(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  this->_map_change = true;
  return;
}

Assistant:

void libserver::server::_handle_login_req()
{
    // TODO::Handle usning unordered map
    std::cout<<client_name<<" logged in"<<std::endl;
    _write_to_socket(_LOGIN_SUCCESS_+"\n");
    _set_map_change();
}